

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O2

void ourWriteOut(CURL *curl,OutStruct *outs,char *writeinfo)

{
  char cVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *pcVar9;
  char *pcVar10;
  FILE *__stream;
  double doubleinfo;
  long longinfo;
  char *stringp;
  
  stringp = (char *)0x0;
  __stream = _stdout;
LAB_0011aa02:
  writeinfo = writeinfo + 1;
  do {
    pcVar10 = writeinfo + -1;
    if (pcVar10 == (char *)0x0) {
      return;
    }
    cVar1 = *pcVar10;
    if (cVar1 != '%') {
      if (cVar1 == '\0') {
        return;
      }
      if (cVar1 != '\\') goto LAB_0011aaa7;
      cVar1 = *writeinfo;
      iVar4 = 0x5c;
      if (cVar1 != '\0') {
        if (cVar1 == 't') {
          iVar4 = 9;
        }
        else {
          iVar4 = 0xd;
          if (cVar1 != 'r') {
            if (cVar1 != 'n') {
              iVar4 = 0x5c;
              goto LAB_0011aa95;
            }
            iVar4 = 10;
          }
        }
        goto LAB_0011ab6b;
      }
LAB_0011aaaa:
      fputc(iVar4,__stream);
      goto LAB_0011aa02;
    }
    cVar2 = *writeinfo;
    if (cVar2 != '{') {
      if (cVar2 == '\0') {
LAB_0011aaa7:
        iVar4 = (int)cVar1;
        goto LAB_0011aaaa;
      }
      iVar4 = 0x25;
      if (cVar2 != '%') {
LAB_0011aa95:
        fputc(iVar4,__stream);
        iVar4 = (int)*writeinfo;
      }
LAB_0011ab6b:
      fputc(iVar4,__stream);
      writeinfo = writeinfo + 1;
      goto LAB_0011aa02;
    }
    pcVar10 = strchr(pcVar10,0x7d);
    if (pcVar10 != (char *)0x0) break;
    fputs("%{",__stream);
    writeinfo = writeinfo + 2;
  } while( true );
  cVar1 = *pcVar10;
  *pcVar10 = '\0';
  lVar3 = 0;
  do {
    lVar6 = lVar3;
    if (lVar6 + 0x10 == 0x220) {
      curl_mfprintf(_stderr,"curl: unknown --write-out variable: \'%s\'\n",writeinfo + 1);
      goto switchD_0011ab1b_default;
    }
    iVar4 = curl_strequal(writeinfo + 1,*(undefined8 *)((long)&replacements[0].name + lVar6));
    lVar3 = lVar6 + 0x10;
  } while (iVar4 == 0);
  switch(*(undefined4 *)((long)&replacements[0].id + lVar6)) {
  case 1:
    uVar8 = 0x300003;
    goto LAB_0011ad08;
  case 2:
    uVar8 = 0x300004;
    goto LAB_0011ad08;
  case 3:
    uVar8 = 0x300005;
    goto LAB_0011ad08;
  case 4:
    uVar8 = 0x300021;
    goto LAB_0011ad08;
  case 5:
    uVar8 = 0x300006;
    goto LAB_0011ad08;
  case 6:
    uVar8 = 0x300011;
    goto LAB_0011ad08;
  case 7:
    uVar8 = 0x300008;
    goto LAB_0011ad69;
  case 8:
    uVar8 = 0x300007;
LAB_0011ad69:
    iVar4 = curl_easy_getinfo(curl,uVar8,&doubleinfo);
    if (iVar4 != 0) goto switchD_0011ab1b_default;
    pcVar7 = "%.0f";
    goto LAB_0011adfe;
  case 9:
    uVar8 = 0x300009;
    goto LAB_0011ade2;
  case 10:
    uVar8 = 0x30000a;
LAB_0011ade2:
    iVar4 = curl_easy_getinfo(curl,uVar8,&doubleinfo);
    if (iVar4 != 0) goto switchD_0011ab1b_default;
    pcVar7 = "%.3f";
    goto LAB_0011adfe;
  case 0xb:
    uVar8 = 0x200002;
    goto LAB_0011adb0;
  case 0xc:
    uVar8 = 0x200016;
LAB_0011adb0:
    iVar4 = curl_easy_getinfo(curl,uVar8,&longinfo);
    if (iVar4 != 0) goto switchD_0011ab1b_default;
    pcVar9 = "%03ld";
    pcVar7 = (char *)longinfo;
    goto LAB_0011af23;
  case 0xd:
    uVar8 = 0x20000b;
    break;
  case 0xe:
    uVar8 = 0x20000c;
    break;
  case 0xf:
    uVar8 = 0x100001;
    goto LAB_0011ae60;
  case 0x10:
    uVar8 = 0x100012;
    goto LAB_0011ae60;
  case 0x11:
    uVar8 = 0x20001a;
    break;
  case 0x12:
    uVar8 = 0x300013;
LAB_0011ad08:
    iVar4 = curl_easy_getinfo(curl,uVar8,&doubleinfo);
    if (iVar4 == 0) {
      pcVar7 = "%.6f";
LAB_0011adfe:
      curl_mfprintf(doubleinfo,__stream,pcVar7);
    }
    goto switchD_0011ab1b_default;
  case 0x13:
    uVar8 = 0x200014;
    break;
  case 0x14:
    uVar8 = 0x10001e;
    goto LAB_0011ae60;
  case 0x15:
    uVar8 = 0x10001f;
LAB_0011ae60:
    iVar4 = curl_easy_getinfo(curl,uVar8,&stringp);
    if (stringp != (char *)0x0 && iVar4 == 0) {
      fputs(stringp,__stream);
    }
    goto switchD_0011ab1b_default;
  case 0x16:
    uVar8 = 0x20000d;
    break;
  case 0x17:
    uVar8 = 0x20002f;
    break;
  case 0x18:
    pcVar7 = outs->filename;
    if (outs->filename == (char *)0x0) goto switchD_0011ab1b_default;
    goto LAB_0011af1c;
  case 0x19:
    uVar8 = 0x100020;
    goto LAB_0011af08;
  case 0x1a:
    uVar8 = 0x200028;
    break;
  case 0x1b:
    uVar8 = 0x100029;
    goto LAB_0011af08;
  case 0x1c:
    uVar8 = 0x20002a;
    break;
  case 0x1d:
    iVar4 = curl_easy_getinfo(curl,0x20002e,&longinfo);
    if (iVar4 == 0) {
      if (longinfo - 1U < 3) {
        pcVar7 = &DAT_00123218 + *(int *)(&DAT_00123218 + (longinfo - 1U) * 4);
      }
      else {
        pcVar7 = "0";
      }
      curl_mfprintf(__stream,pcVar7);
    }
    goto switchD_0011ab1b_default;
  case 0x1e:
    uVar8 = 0x100031;
LAB_0011af08:
    iVar4 = curl_easy_getinfo(curl,uVar8,&stringp);
    pcVar7 = stringp;
    if (iVar4 != 0) goto switchD_0011ab1b_default;
LAB_0011af1c:
    pcVar9 = "%s";
    goto LAB_0011af23;
  case 0x1f:
    puVar5 = (undefined8 *)&stdout;
    goto LAB_0011ae14;
  case 0x20:
    puVar5 = (undefined8 *)&stderr;
LAB_0011ae14:
    __stream = (FILE *)*puVar5;
  default:
    goto switchD_0011ab1b_default;
  }
  iVar4 = curl_easy_getinfo(curl,uVar8,&longinfo);
  if (iVar4 == 0) {
    pcVar9 = "%ld";
    pcVar7 = (char *)longinfo;
LAB_0011af23:
    curl_mfprintf(__stream,pcVar9,pcVar7);
  }
switchD_0011ab1b_default:
  writeinfo = pcVar10 + 1;
  *pcVar10 = cVar1;
  goto LAB_0011aa02;
}

Assistant:

void ourWriteOut(CURL *curl, struct OutStruct *outs, const char *writeinfo)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  char *stringp = NULL;
  long longinfo;
  double doubleinfo;

  while(ptr && *ptr) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        if('{' == ptr[1]) {
          char keepit;
          int i;
          bool match = FALSE;
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          keepit = *end;
          *end = 0; /* zero terminate */
          for(i = 0; replacements[i].name; i++) {
            if(curl_strequal(ptr, replacements[i].name)) {
              match = TRUE;
              switch(replacements[i].id) {
              case VAR_EFFECTIVE_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_HTTP_CODE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HTTP_CODE_PROXY:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_CONNECTCODE,
                                     &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HEADER_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HEADER_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REQUEST_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REQUEST_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_NUM_CONNECTS:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NUM_CONNECTS, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_COUNT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_COUNT, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_TOTAL_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_TOTAL_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_NAMELOOKUP_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NAMELOOKUP_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_CONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_CONNECT_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_APPCONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_APPCONNECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_PRETRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRETRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_STARTTRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_STARTTRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_SIZE_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SIZE_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SPEED_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_SPEED_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_CONTENT_TYPE:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_CONTENT_TYPE, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_FTP_ENTRY_PATH:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_FTP_ENTRY_PATH, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_REDIRECT_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_REDIRECT_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_PROXY_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PROXY_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_EFFECTIVE_FILENAME:
                if(outs->filename)
                  fprintf(stream, "%s", outs->filename);
                break;
              case VAR_PRIMARY_IP:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRIMARY_IP,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_PRIMARY_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRIMARY_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_LOCAL_IP:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_LOCAL_IP,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_LOCAL_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_LOCAL_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_HTTP_VERSION:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_VERSION,
                                     &longinfo)) {
                  const char *version = "0";
                  switch(longinfo) {
                  case CURL_HTTP_VERSION_1_0:
                    version = "1.0";
                    break;
                  case CURL_HTTP_VERSION_1_1:
                    version = "1.1";
                    break;
                  case CURL_HTTP_VERSION_2_0:
                    version = "2";
                    break;
                  }

                  fprintf(stream, version);
                }
                break;
              case VAR_SCHEME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SCHEME,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_STDOUT:
                stream = stdout;
                break;
              case VAR_STDERR:
                stream = stderr;
                break;
              default:
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }

}